

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int operation_wait(cubeb_conflict *ctx,pa_stream *stream,pa_operation *o)

{
  pa_operation_state_t pVar1;
  pa_context_state_t pVar2;
  pa_stream_state_t pVar3;
  
  pVar1 = (*cubeb_pa_operation_get_state)(o);
  while( true ) {
    if (pVar1 != PA_OPERATION_RUNNING) {
      return 0;
    }
    (*cubeb_pa_threaded_mainloop_wait)(ctx->mainloop);
    pVar2 = (*cubeb_pa_context_get_state)(ctx->context);
    if (pVar2 - PA_CONTEXT_FAILED < 0xfffffffc) break;
    if ((stream != (pa_stream *)0x0) &&
       (pVar3 = (*cubeb_pa_stream_get_state)(stream), pVar3 - PA_STREAM_FAILED < 0xfffffffe)) {
      return -1;
    }
    pVar1 = (*cubeb_pa_operation_get_state)(o);
  }
  return -1;
}

Assistant:

static int
operation_wait(cubeb * ctx, pa_stream * stream, pa_operation * o)
{
  while (WRAP(pa_operation_get_state)(o) == PA_OPERATION_RUNNING) {
    WRAP(pa_threaded_mainloop_wait)(ctx->mainloop);
    if (!PA_CONTEXT_IS_GOOD(WRAP(pa_context_get_state)(ctx->context))) {
      return -1;
    }
    if (stream && !PA_STREAM_IS_GOOD(WRAP(pa_stream_get_state)(stream))) {
      return -1;
    }
  }
  return 0;
}